

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O2

size_t ggml_backend_sched_get_buffer_size(ggml_backend_sched_t sched,ggml_backend_t backend)

{
  int buffer_id;
  size_t sVar1;
  
  buffer_id = ggml_backend_sched_backend_id(sched,backend);
  if ((-1 < buffer_id) && (buffer_id < sched->n_backends)) {
    sVar1 = ggml_gallocr_get_buffer_size(sched->galloc,buffer_id);
    return sVar1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,0x657,"GGML_ASSERT(%s) failed",
             "backend_index >= 0 && backend_index < sched->n_backends");
}

Assistant:

size_t ggml_backend_sched_get_buffer_size(ggml_backend_sched_t sched, ggml_backend_t backend) {
    int backend_index = ggml_backend_sched_backend_id(sched, backend);
    GGML_ASSERT(backend_index >= 0 && backend_index < sched->n_backends);

    return ggml_gallocr_get_buffer_size(sched->galloc, backend_index);
}